

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptlinux.c
# Opt level: O0

PtTimestamp Pt_Time(void)

{
  int local_28 [2];
  timeb now;
  long milliseconds;
  long seconds;
  
  ftime(local_28);
  return (local_28[0] - (int)time_offset.time) * 1000 +
         ((uint)(ushort)now.time - (uint)time_offset.millitm);
}

Assistant:

PtTimestamp Pt_Time()
{
    long seconds, milliseconds;
    struct timeb now;
    ftime(&now);
    seconds = now.time - time_offset.time;
    milliseconds = now.millitm - time_offset.millitm;
    return seconds * 1000 + milliseconds;
}